

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

ARCHIVE_DEVICE_DATA_FLAGS Diligent::RenderDeviceTypeToArchiveDataFlag(RENDER_DEVICE_TYPE DevType)

{
  Char *pCVar1;
  undefined1 local_60 [8];
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  RENDER_DEVICE_TYPE DevType_local;
  
  msg.field_2._8_4_ = DevType;
  switch(DevType) {
  case RENDER_DEVICE_TYPE_D3D11:
    msg.field_2._12_4_ = 1;
    break;
  case RENDER_DEVICE_TYPE_D3D12:
    msg.field_2._12_4_ = 2;
    break;
  case RENDER_DEVICE_TYPE_GL:
    msg.field_2._12_4_ = 4;
    break;
  case RENDER_DEVICE_TYPE_GLES:
    msg.field_2._12_4_ = 8;
    break;
  case RENDER_DEVICE_TYPE_VULKAN:
    msg.field_2._12_4_ = 0x10;
    break;
  case RENDER_DEVICE_TYPE_METAL:
    FormatString<char[40]>
              ((string *)local_30,(char (*) [40])"Metal is not supported on this platform");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"RenderDeviceTypeToArchiveDataFlag",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x782);
    std::__cxx11::string::~string((string *)local_30);
    msg.field_2._12_4_ = 0;
    break;
  case RENDER_DEVICE_TYPE_WEBGPU:
    msg.field_2._12_4_ = 0x80;
    break;
  default:
    FormatString<char[23]>((string *)local_60,(char (*) [23])"Unexpected device type");
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"RenderDeviceTypeToArchiveDataFlag",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x78a);
    std::__cxx11::string::~string((string *)local_60);
    msg.field_2._12_4_ = 0;
  }
  return msg.field_2._12_4_;
}

Assistant:

ARCHIVE_DEVICE_DATA_FLAGS RenderDeviceTypeToArchiveDataFlag(RENDER_DEVICE_TYPE DevType)
{
    static_assert(RENDER_DEVICE_TYPE_COUNT == 8, "Please update the switch below to handle the new device type");
    switch (DevType)
    {
        case RENDER_DEVICE_TYPE_D3D11:
            return ARCHIVE_DEVICE_DATA_FLAG_D3D11;

        case RENDER_DEVICE_TYPE_D3D12:
            return ARCHIVE_DEVICE_DATA_FLAG_D3D12;

        case RENDER_DEVICE_TYPE_GL:
            return ARCHIVE_DEVICE_DATA_FLAG_GL;

        case RENDER_DEVICE_TYPE_GLES:
            return ARCHIVE_DEVICE_DATA_FLAG_GLES;

        case RENDER_DEVICE_TYPE_VULKAN:
            return ARCHIVE_DEVICE_DATA_FLAG_VULKAN;

        case RENDER_DEVICE_TYPE_METAL:
#if PLATFORM_MACOS
            return ARCHIVE_DEVICE_DATA_FLAG_METAL_MACOS;
#elif PLATFORM_IOS
            return ARCHIVE_DEVICE_DATA_FLAG_METAL_IOS;
#else
            UNEXPECTED("Metal is not supported on this platform");
            return ARCHIVE_DEVICE_DATA_FLAG_NONE;
#endif

        case RENDER_DEVICE_TYPE_WEBGPU:
            return ARCHIVE_DEVICE_DATA_FLAG_WEBGPU;

        default:
            UNEXPECTED("Unexpected device type");
            return ARCHIVE_DEVICE_DATA_FLAG_NONE;
    }
}